

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeLeadingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  long lVar3;
  bool bVar4;
  
  cur = nodes;
  if (node != (xmlNodePtr)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
    }
    else if ((((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
             (nodes->nodeTab != (xmlNodePtr *)0x0)) &&
            ((iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0 &&
             (iVar1 = nodes->nodeNr, 0 < (long)iVar1)))) {
      lVar3 = 0;
      do {
        if (lVar3 < nodes->nodeNr) {
          val = nodes->nodeTab[lVar3];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
      } while (((val != node) && (iVar2 = xmlXPathNodeSetAddUnique(cur,val), -1 < iVar2)) &&
              (bVar4 = (long)iVar1 + -1 != lVar3, lVar3 = lVar3 + 1, bVar4));
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeLeadingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
        /* TODO: Propagate memory error. */
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	    break;
    }
    return(ret);
}